

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats(ConsumerEndpointImpl *this)

{
  TaskRunner *pTVar1;
  undefined8 uVar2;
  TracingSession *tracing_session;
  _func_void *p_Var3;
  WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl> weak_this;
  TraceStats stats;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  __shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  local_1a8;
  undefined1 local_198 [24];
  TraceStats local_180;
  TraceStats local_d0;
  
  protos::gen::TraceStats::TraceStats(&local_d0);
  tracing_session = GetTracingSession(this->service_,this->tracing_session_id_);
  if (tracing_session != (TracingSession *)0x0) {
    TracingServiceImpl::GetTraceStats((TraceStats *)local_198,this->service_,tracing_session);
    protos::gen::TraceStats::operator=(&local_d0,(TraceStats *)local_198);
    protos::gen::TraceStats::~TraceStats((TraceStats *)local_198);
  }
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_1a8,
               (__shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&this->weak_ptr_factory_);
  pTVar1 = this->task_runner_;
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)local_198,&local_1a8);
  local_198[0x10] = (code)(tracing_session != (TracingSession *)0x0);
  protos::gen::TraceStats::TraceStats(&local_180,&local_d0);
  local_1b8 = (code *)0x0;
  pcStack_1b0 = (code *)0x0;
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  p_Var3 = (_func_void *)operator_new(200);
  uVar2 = local_198._8_8_;
  local_198._8_8_ = (pointer)0x0;
  *(undefined8 *)p_Var3 = local_198._0_8_;
  *(undefined8 *)(p_Var3 + 8) = uVar2;
  local_198._0_8_ = (_func_int **)0x0;
  p_Var3[0x10] = local_198[0x10];
  protos::gen::TraceStats::TraceStats((TraceStats *)(p_Var3 + 0x18),&local_180);
  pcStack_1b0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59649:26)>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59649:26)>
              ::_M_manager;
  local_1c8._M_unused._M_function_pointer = p_Var3;
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  GetTraceStats()::$_0::~__0((__0 *)local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
  protos::gen::TraceStats::~TraceStats(&local_d0);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  bool success = false;
  TraceStats stats;
  TracingSession* session = service_->GetTracingSession(tracing_session_id_);
  if (session) {
    success = true;
    stats = service_->GetTraceStats(session);
  }
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, success, stats] {
    if (weak_this)
      weak_this->consumer_->OnTraceStats(success, stats);
  });
}